

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cc
# Opt level: O0

void anon_unknown.dwarf_1c82::PrintUsage(ostream *stream)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," frame - extract frame");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  usage:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       frame [ options ] [ infile ] > stdout");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  options:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -l l  : frame length       (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x100);
  poVar2 = std::operator<<(poVar2,"][ 1 <= l <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -p p  : frame period       (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,100);
  poVar2 = std::operator<<(poVar2,"][ 1 <= p <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -n n  : framing type       (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][ 0 <= t <= 1 ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,
                           "                0 (the beginning of data is the center of the first frame)"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,
                           "                1 (the beginning of data is the start of the first frame)"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -z    : mean subtraction   (  bool)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = std::operator<<(poVar2,"FALSE");
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -h    : print this message");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  infile:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       data sequence              (double)[stdin]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  stdout:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       extracted data sequence    (double)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " frame - extract frame" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       frame [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : frame length       (   int)[" << std::setw(5) << std::right << kDefaultFrameLength << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -p p  : frame period       (   int)[" << std::setw(5) << std::right << kDefaultFramePeriod << "][ 1 <= p <=   ]" << std::endl;  // NOLINT
  *stream << "       -n n  : framing type       (   int)[" << std::setw(5) << std::right << kDefaultFramingType << "][ 0 <= t <= 1 ]" << std::endl;  // NOLINT
  *stream << "                0 (the beginning of data is the center of the first frame)" << std::endl;  // NOLINT
  *stream << "                1 (the beginning of data is the start of the first frame)" << std::endl;  // NOLINT
  *stream << "       -z    : mean subtraction   (  bool)[" << std::setw(5) << std::right << "FALSE"             << "]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (double)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       extracted data sequence    (double)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}